

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

void * utf8chr(void *src,long chr)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong in_RSI;
  char *in_RDI;
  char *s;
  char c [5];
  char *local_28;
  byte local_1d;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  ulong local_18;
  char *local_10;
  char *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_1d,0,5);
  if (local_18 == 0) {
    for (local_28 = local_10; *local_28 != '\0'; local_28 = local_28 + 1) {
    }
    local_8 = local_28;
  }
  else {
    bVar1 = (byte)local_18;
    local_1d = bVar1;
    if ((local_18 & 0xffffff80) != 0) {
      bVar2 = (byte)((long)local_18 >> 6);
      if ((local_18 & 0xfffff800) == 0) {
        local_1d = bVar2 | 0xc0;
        bVar3 = bVar1;
      }
      else {
        bVar3 = (byte)((long)local_18 >> 0xc);
        if ((local_18 & 0xffff0000) == 0) {
          local_1d = bVar3 | 0xe0;
          bVar3 = bVar2;
          bVar2 = bVar1;
        }
        else {
          local_1d = (byte)((long)local_18 >> 0x12) | 0xf0;
          local_1a = bVar1 & 0x3f | 0x80;
        }
        local_1b = bVar2 & 0x3f | 0x80;
      }
      local_1c = bVar3 & 0x3f | 0x80;
    }
    local_8 = (char *)utf8str(local_10,&local_1d);
  }
  return local_8;
}

Assistant:

void *utf8chr(const void *src, long chr) {
  char c[5] = {'\0', '\0', '\0', '\0', '\0'};

  if (0 == chr) {
    // being asked to return position of null terminating byte, so
    // just run s to the end, and return!
    const char *s = (const char *)src;
    while ('\0' != *s) {
      s++;
    }
    return (void *)s;
  } else if (0 == ((long)0xffffff80 & chr)) {
    // 1-byte/7-bit ascii
    // (0b0xxxxxxx)
    c[0] = (char)chr;
  } else if (0 == ((long)0xfffff800 & chr)) {
    // 2-byte/11-bit utf8 code point
    // (0b110xxxxx 0b10xxxxxx)
    c[0] = 0xc0 | (char)(chr >> 6);
    c[1] = 0x80 | (char)(chr & 0x3f);
  } else if (0 == ((long)0xffff0000 & chr)) {
    // 3-byte/16-bit utf8 code point
    // (0b1110xxxx 0b10xxxxxx 0b10xxxxxx)
    c[0] = 0xe0 | (char)(chr >> 12);
    c[1] = 0x80 | (char)((chr >> 6) & 0x3f);
    c[2] = 0x80 | (char)(chr & 0x3f);
  } else { // if (0 == ((int)0xffe00000 & chr)) {
    // 4-byte/21-bit utf8 code point
    // (0b11110xxx 0b10xxxxxx 0b10xxxxxx 0b10xxxxxx)
    c[0] = 0xf0 | (char)(chr >> 18);
    c[1] = 0x80 | (char)((chr >> 12) & 0x3f);
    c[2] = 0x80 | (char)((chr >> 6) & 0x3f);
    c[3] = 0x80 | (char)(chr & 0x3f);
  }

  // we've made c into a 2 utf8 codepoint string, one for the chr we are
  // seeking, another for the null terminating byte. Now use utf8str to
  // search
  return utf8str(src, c);
}